

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

qint64 __thiscall QBuffer::writeData(QBuffer *this,char *data,qint64 len)

{
  QObjectData *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  QBindingStatus *this_00;
  HANDLE size;
  long in_FS_OFFSET;
  qint64 qStack_60;
  QMessageLogger local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar2 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])();
  size = (HANDLE)(CONCAT44(extraout_var,iVar2) + len);
  this_00 = pQVar1[4].bindingStorage.bindingStatus;
  if (this_00->threadId < size) {
    QByteArray::resize((QByteArray *)this_00,(qsizetype)size);
    this_00 = pQVar1[4].bindingStorage.bindingStatus;
    if (this_00->threadId != size) {
      local_50.context.version = 2;
      local_50.context.function._4_4_ = 0;
      local_50.context._4_8_ = 0;
      local_50.context._12_8_ = 0;
      local_50.context.category = "default";
      QMessageLogger::warning(&local_50,"QBuffer::writeData: Memory allocation error");
      qStack_60 = -1;
      len = qStack_60;
      goto LAB_0020e9b9;
    }
  }
  pcVar3 = QByteArray::data((QByteArray *)this_00);
  iVar2 = (*(this->super_QIODevice).super_QObject._vptr_QObject[0xf])(this);
  memcpy(pcVar3 + CONCAT44(extraout_var_00,iVar2),data,len);
  pQVar1[5].children.d.d =
       (Data *)((long)&((pQVar1[5].children.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + len);
  if (((*(int *)&pQVar1[5].children.d.ptr != 0) &&
      (*(char *)((long)&pQVar1[5].children.d.ptr + 4) == '\0')) &&
     ((((this->super_QIODevice).super_QObject.d_ptr.d)->field_0x30 & 2) == 0)) {
    *(undefined1 *)((long)&pQVar1[5].children.d.ptr + 4) = 1;
    QMetaObject::invokeMethod<>((QObject *)this,"_q_emitSignals",QueuedConnection);
  }
LAB_0020e9b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return len;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QBuffer::writeData(const char *data, qint64 len)
{
    Q_D(QBuffer);
    const quint64 required = quint64(pos()) + quint64(len); // cannot overflow (pos() ≥ 0, len ≥ 0)

    if (required > quint64(d->buf->size())) { // capacity exceeded
        // The following must hold, since qsizetype covers half the virtual address space:
        Q_ASSERT(required <= quint64((std::numeric_limits<qsizetype>::max)()));
        d->buf->resize(qsizetype(required));
        if (quint64(d->buf->size()) != required) { // could not resize
            qWarning("QBuffer::writeData: Memory allocation error");
            return -1;
        }
    }

    memcpy(d->buf->data() + pos(), data, size_t(len));

#ifndef QT_NO_QOBJECT
    d->writtenSinceLastEmit += len;
    if (d->signalConnectionCount && !d->signalsEmitted && !signalsBlocked()) {
        d->signalsEmitted = true;
        QMetaObject::invokeMethod(this, "_q_emitSignals", Qt::QueuedConnection);
    }
#endif
    return len;
}